

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void IT8951DisplayArea1bpp
               (uint16_t usX,uint16_t usY,uint16_t usW,uint16_t usH,uint16_t usDpyMode,
               uint8_t ucBGGrayVal,uint8_t ucFGGrayVal)

{
  uint16_t uVar1;
  
  LCDWriteCmdCode(0x10);
  LCDWriteData(0x113a);
  uVar1 = LCDReadData();
  LCDWriteCmdCode(0x11);
  LCDWriteData(0x113a);
  LCDWriteData(uVar1 | 4);
  LCDWriteCmdCode(0x11);
  LCDWriteData(0x1250);
  LCDWriteData(CONCAT11(ucBGGrayVal,ucFGGrayVal));
  IT8951DisplayArea(usX,usY,usW,usH,usDpyMode);
  IT8951WaitForDisplayReady();
  LCDWriteCmdCode(0x10);
  LCDWriteData(0x113a);
  uVar1 = LCDReadData();
  LCDWriteCmdCode(0x11);
  LCDWriteData(0x113a);
  LCDWriteData(uVar1 & 0xfffb);
  return;
}

Assistant:

void IT8951DisplayArea1bpp(uint16_t usX, uint16_t usY, uint16_t usW, uint16_t usH, uint16_t usDpyMode, uint8_t ucBGGrayVal, uint8_t ucFGGrayVal)
{
    //Set Display mode to 1 bpp mode - Set 0x18001138 Bit[18](0x1800113A Bit[2])to 1
    IT8951WriteReg(UP1SR+2, IT8951ReadReg(UP1SR+2) | (1<<2));
    
    //Set BitMap color table 0 and 1 , => Set Register[0x18001250]:
    //Bit[7:0]: ForeGround Color(G0~G15)  for 1
    //Bit[15:8]:Background Color(G0~G15)  for 0
    IT8951WriteReg(BGVR, (ucBGGrayVal<<8) | ucFGGrayVal);
    
    //Display
    IT8951DisplayArea( usX, usY, usW, usH, usDpyMode);
    IT8951WaitForDisplayReady();
    
    //Restore to normal mode
    IT8951WriteReg(UP1SR+2, IT8951ReadReg(UP1SR+2) & ~(1<<2));
}